

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http1_parser.c
# Opt level: O3

size_t http1_fio_parser_fn(http1_fio_parser_args_s *args)

{
  uint8_t *puVar1;
  ssize_t *psVar2;
  char cVar3;
  _func_int_http1_parser_s_ptr_size_t_char_ptr_size_t *p_Var4;
  byte bVar5;
  byte bVar6;
  uint8_t uVar7;
  int iVar8;
  byte *pbVar9;
  void *pvVar10;
  void *pvVar11;
  size_t sVar12;
  byte *pbVar13;
  __int32_t **pp_Var14;
  long lVar15;
  void *pvVar16;
  byte *pbVar17;
  long lVar18;
  char cVar19;
  byte bVar20;
  http1_parser_s *phVar21;
  byte *pbVar22;
  ulong uVar23;
  char *pcVar24;
  byte *pbVar25;
  bool bVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  byte *local_58;
  byte *local_40;
  byte *local_38;
  
  phVar21 = args->parser;
  (phVar21->state).next = (uint8_t *)0x0;
  pbVar22 = (byte *)args->buffer;
  pbVar9 = pbVar22 + args->length;
  bVar20 = (phVar21->state).reserved;
  pbVar25 = pbVar22;
LAB_0015f83c:
  bVar5 = bVar20 & 0xf;
  if (bVar5 != 3) {
    if (bVar5 != 1) {
      pbVar25 = pbVar22;
      if (bVar5 != 0) goto LAB_001600df;
      while( true ) {
        if (pbVar9 <= pbVar22) goto LAB_00160135;
        bVar5 = *pbVar22;
        uVar23 = (ulong)bVar5;
        if ((0x20 < uVar23) || ((0x100002401U >> (uVar23 & 0x3f) & 1) == 0)) break;
        pbVar22 = pbVar22 + 1;
        pbVar25 = pbVar25 + 1;
      }
      pvVar10 = memchr(pbVar22,10,(long)pbVar9 - (long)pbVar25);
      if (pvVar10 == (void *)0x0) goto LAB_00160135;
      bVar6 = (*(char *)((long)pvVar10 + -1) == '\r') + 1;
      if ((((bVar5 == 0x48) && (pbVar22[1] == 0x54)) && (pbVar22[2] == 0x54)) &&
         (pbVar22[3] == 0x50)) {
        pvVar16 = (void *)((long)pvVar10 - (ulong)bVar6);
        pbVar13 = (byte *)((long)pvVar16 + 1);
        (phVar21->state).reserved = bVar20 | 0x80;
        if ((((pbVar13 <= pbVar22) || (*pbVar22 == 0x20)) ||
            ((pvVar11 = memchr(pbVar22,0x20,(long)pvVar16 + (1 - (long)pbVar25)),
             pvVar11 == (void *)0x0 ||
             (((iVar8 = (*args->on_http_version)
                                  (phVar21,(char *)pbVar22,(long)pvVar11 - (long)pbVar25),
               iVar8 != 0 || (pvVar16 <= pvVar11)) ||
              (pcVar24 = (char *)((long)pvVar11 + 1), *pcVar24 == ' ')))))) ||
           (pvVar16 = memchr(pcVar24,0x20,(long)pbVar13 - (long)pcVar24), pvVar16 == (void *)0x0))
        goto LAB_001600fd;
        phVar21 = args->parser;
        p_Var4 = args->on_status;
        sVar12 = atol(pcVar24);
        iVar8 = (*p_Var4)(phVar21,sVar12,(char *)((long)pvVar16 + 1),(long)pbVar13 - (long)pvVar16);
LAB_0015fc64:
        if (iVar8 != 0) goto LAB_001600fd;
      }
      else {
        pp_Var14 = __ctype_tolower_loc();
        if ((*pp_Var14)[uVar23] - 0x61U < 0x1a) {
          pvVar16 = (void *)((long)pvVar10 - (ulong)bVar6);
          pbVar13 = (byte *)((long)pvVar16 + 1);
          local_40 = (byte *)0x0;
          if (((pbVar13 <= pbVar22) || (*pbVar22 == 0x20)) ||
             ((pvVar11 = memchr(pbVar22,0x20,(long)pvVar16 + (1 - (long)pbVar25)),
              pvVar11 == (void *)0x0 ||
              (iVar8 = (*args->on_method)(phVar21,(char *)pbVar22,(long)pvVar11 - (long)pbVar25),
              iVar8 != 0)))) goto LAB_001600fd;
          cVar19 = *(char *)((long)pvVar11 + 1);
          if (((cVar19 == 'h') && (cVar19 = 'h', *(char *)((long)pvVar11 + 2) == 't')) &&
             ((*(char *)((long)pvVar11 + 3) == 't' && (*(char *)((long)pvVar11 + 4) == 'p')))) {
            if (*(char *)((long)pvVar11 + 5) != 's') {
              if ((*(char *)((long)pvVar11 + 5) == ':') && (*(char *)((long)pvVar11 + 6) == '/')) {
                lVar18 = 8;
                cVar3 = *(char *)((long)pvVar11 + 7);
                goto joined_r0x0015faa2;
              }
              goto LAB_0015fb1b;
            }
            if ((*(char *)((long)pvVar11 + 6) != ':') || (*(char *)((long)pvVar11 + 7) != '/'))
            goto LAB_0015fb1b;
            lVar18 = 9;
            cVar3 = *(char *)((long)pvVar11 + 8);
joined_r0x0015faa2:
            if (cVar3 != '/') goto LAB_0015fb1b;
            local_58 = (byte *)((long)pvVar11 + lVar18);
            local_40 = local_58;
            local_38 = local_58;
            uVar7 = seek2ch(&local_38,pbVar13,' ');
            pbVar25 = local_38;
            if (uVar7 == '\0') goto LAB_001600fd;
            *local_38 = 0x20;
            uVar7 = seek2ch(&local_40,local_38,'/');
            if (uVar7 != '\0') {
              *local_40 = 0x2f;
              cVar19 = '/';
              pbVar22 = local_40;
              goto LAB_0015fb24;
            }
            phVar21 = args->parser;
            sVar12 = 1;
            pbVar22 = (byte *)0x165cca;
LAB_0015fbfd:
            iVar8 = (*args->on_path)(phVar21,(char *)pbVar22,sVar12);
LAB_0015fc00:
            if (iVar8 != 0) goto LAB_001600fd;
          }
          else {
LAB_0015fb1b:
            local_58 = (byte *)0x0;
            pbVar22 = (byte *)((long)pvVar11 + 1);
LAB_0015fb24:
            if (pbVar13 <= pbVar22) goto LAB_001600fd;
            if (cVar19 == '?') {
LAB_0015fbd0:
              pbVar25 = (byte *)memchr(pbVar22,0x20,(long)pbVar13 - (long)pbVar22);
              if (pbVar25 != (byte *)0x0) {
                phVar21 = args->parser;
                sVar12 = (long)pbVar25 - (long)pbVar22;
                goto LAB_0015fbfd;
              }
              goto LAB_001600fd;
            }
            pvVar11 = memchr(pbVar22,0x3f,(long)pbVar13 - (long)pbVar22);
            if (pvVar11 == (void *)0x0) {
              if (cVar19 != ' ') goto LAB_0015fbd0;
              goto LAB_001600fd;
            }
            iVar8 = (*args->on_path)(args->parser,(char *)pbVar22,(long)pvVar11 - (long)pbVar22);
            if ((((iVar8 != 0) || (pvVar16 <= pvVar11)) ||
                (pcVar24 = (char *)((long)pvVar11 + 1), *pcVar24 == ' ')) ||
               (pbVar25 = (byte *)memchr(pcVar24,0x20,(long)pbVar13 - (long)pcVar24),
               pbVar25 == (byte *)0x0)) goto LAB_001600fd;
            if (0 < (long)pbVar25 - (long)pcVar24) {
              iVar8 = (*args->on_query)(args->parser,pcVar24,(long)pbVar25 - (long)pcVar24);
              goto LAB_0015fc00;
            }
          }
          if ((pbVar13 <= pbVar25 + 6) ||
             (iVar8 = (*args->on_http_version)
                                (args->parser,(char *)(pbVar25 + 1),
                                 (long)pbVar13 - (long)(pbVar25 + 1)), iVar8 != 0))
          goto LAB_001600fd;
          if (local_58 != (byte *)0x0) {
            iVar8 = (*args->on_header)(args->parser,"host",4,(char *)local_58,
                                       (long)local_40 - (long)local_58);
            goto LAB_0015fc64;
          }
        }
      }
      pbVar22 = (byte *)((long)pvVar10 + 1);
      phVar21 = args->parser;
      puVar1 = &(phVar21->state).reserved;
      *puVar1 = *puVar1 | 1;
      pbVar25 = pbVar22;
    }
    do {
      if (pbVar9 <= pbVar22) goto LAB_00160135;
      bVar20 = *pbVar22;
      if ((bVar20 == 10) || (bVar20 == 0xd)) break;
      if ((pbVar9 <= pbVar25) ||
         ((*pbVar25 == 10 ||
          (pvVar10 = memchr(pbVar25,10,(long)pbVar9 - (long)pbVar25), pvVar10 == (void *)0x0)))) {
        return (long)pbVar22 - (long)args->buffer;
      }
      if (((bVar20 == 0x3a) ||
          (pbVar25 = (byte *)((long)pvVar10 - (ulong)(*(char *)((long)pvVar10 + -1) == '\r')),
          pbVar25 <= pbVar22)) ||
         (pbVar13 = (byte *)memchr(pbVar22,0x3a,(long)pbVar25 - (long)pbVar22),
         pbVar13 == (byte *)0x0)) goto LAB_001600fd;
      if (pbVar22 < pbVar13) {
        pp_Var14 = __ctype_tolower_loc();
        pbVar17 = pbVar22;
        do {
          *pbVar17 = *(byte *)(*pp_Var14 + *pbVar17);
          pbVar17 = pbVar17 + 1;
        } while (pbVar17 != pbVar13);
      }
      sVar12 = (long)pbVar13 - (long)pbVar22;
      pbVar17 = pbVar13 + 1;
      if (pbVar13[1] == 0x20) {
        pbVar17 = pbVar13 + 2;
      }
      if (sVar12 == 7) {
        if (*(int *)(pbVar22 + 3) == 0x72656c69 && *(int *)pbVar22 == 0x69617274) {
          puVar1 = &(args->parser->state).reserved;
          *puVar1 = *puVar1 | 0x60;
        }
      }
      else if (sVar12 == 0xe) {
        if (*(long *)(pbVar22 + 6) == 0x6874676e656c2d74 && *(long *)pbVar22 == 0x2d746e65746e6f63)
        {
          lVar18 = atol((char *)pbVar17);
          (args->parser->state).content_length = lVar18;
        }
      }
      else if (((sVar12 == 0x11) &&
               (auVar27[0] = -(*pbVar22 == 't'), auVar27[1] = -(pbVar22[1] == 'r'),
               auVar27[2] = -(pbVar22[2] == 'a'), auVar27[3] = -(pbVar22[3] == 'n'),
               auVar27[4] = -(pbVar22[4] == 's'), auVar27[5] = -(pbVar22[5] == 'f'),
               auVar27[6] = -(pbVar22[6] == 'e'), auVar27[7] = -(pbVar22[7] == 'r'),
               auVar27[8] = -(pbVar22[8] == '-'), auVar27[9] = -(pbVar22[9] == 'e'),
               auVar27[10] = -(pbVar22[10] == 'n'), auVar27[0xb] = -(pbVar22[0xb] == 'c'),
               auVar27[0xc] = -(pbVar22[0xc] == 'o'), auVar27[0xd] = -(pbVar22[0xd] == 'd'),
               auVar27[0xe] = -(pbVar22[0xe] == 'i'), auVar27[0xf] = -(pbVar22[0xf] == 'n'),
               auVar28[0] = -(pbVar22[0x10] == 'g'), auVar28[1] = 0xff, auVar28[2] = 0xff,
               auVar28[3] = 0xff, auVar28[4] = 0xff, auVar28[5] = 0xff, auVar28[6] = 0xff,
               auVar28[7] = 0xff, auVar28[8] = 0xff, auVar28[9] = 0xff, auVar28[10] = 0xff,
               auVar28[0xb] = 0xff, auVar28[0xc] = 0xff, auVar28[0xd] = 0xff, auVar28[0xe] = 0xff,
               auVar28[0xf] = 0xff, auVar28 = auVar28 & auVar27,
               (ushort)((ushort)(SUB161(auVar28 >> 7,0) & 1) |
                        (ushort)(SUB161(auVar28 >> 0xf,0) & 1) << 1 |
                        (ushort)(SUB161(auVar28 >> 0x17,0) & 1) << 2 |
                        (ushort)(SUB161(auVar28 >> 0x1f,0) & 1) << 3 |
                        (ushort)(SUB161(auVar28 >> 0x27,0) & 1) << 4 |
                        (ushort)(SUB161(auVar28 >> 0x2f,0) & 1) << 5 |
                        (ushort)(SUB161(auVar28 >> 0x37,0) & 1) << 6 |
                        (ushort)(SUB161(auVar28 >> 0x3f,0) & 1) << 7 |
                        (ushort)(SUB161(auVar28 >> 0x47,0) & 1) << 8 |
                        (ushort)(SUB161(auVar28 >> 0x4f,0) & 1) << 9 |
                        (ushort)(SUB161(auVar28 >> 0x57,0) & 1) << 10 |
                        (ushort)(SUB161(auVar28 >> 0x5f,0) & 1) << 0xb |
                        (ushort)(SUB161(auVar28 >> 0x67,0) & 1) << 0xc |
                        (ushort)(SUB161(auVar28 >> 0x6f,0) & 1) << 0xd |
                        (ushort)(SUB161(auVar28 >> 0x77,0) & 1) << 0xe |
                       (ushort)(byte)(auVar28[0xf] >> 7) << 0xf) == 0xffff)) &&
              (*(int *)(pbVar17 + 3) != 0x64656b6e || *(int *)pbVar17 != 0x6e756863)) {
        puVar1 = &(args->parser->state).reserved;
        *puVar1 = *puVar1 | 0x40;
      }
      iVar8 = (*args->on_header)(args->parser,(char *)pbVar22,sVar12,(char *)pbVar17,
                                 (long)pbVar25 - (long)pbVar17);
      if (iVar8 != 0) goto LAB_001600fd;
      pbVar22 = (byte *)((long)pvVar10 + 1);
      phVar21 = args->parser;
      pbVar25 = pbVar22;
    } while (((phVar21->state).reserved & 2) == 0);
    pbVar25 = pbVar22 + 2;
    pbVar13 = pbVar22 + 1;
    pbVar22 = pbVar22 + 1;
    if (*pbVar13 == 10) {
      pbVar22 = pbVar25;
    }
    bVar20 = (phVar21->state).reserved | 2;
    (phVar21->state).reserved = bVar20;
    pbVar25 = pbVar22;
  }
  lVar18 = (phVar21->state).content_length;
  pbVar13 = pbVar22;
  if (lVar18 < 1) {
    if ((bVar20 & 0x40) != 0) {
      pbVar17 = (byte *)((long)args->buffer + args->length);
      do {
        pbVar22 = pbVar13;
        if (pbVar17 <= pbVar13) goto LAB_001600df;
        if (lVar18 == 0) {
          if (pbVar17 <= pbVar13) goto LAB_001600df;
          do {
            if ((*pbVar22 != 0xd) && (*pbVar22 != 10)) break;
            pbVar22 = pbVar22 + 1;
          } while (pbVar22 < pbVar17);
          if (((*pbVar13 == 10) ||
              (pbVar13 = (byte *)memchr(pbVar13,10,(long)pbVar17 - (long)pbVar13),
              pbVar13 == (byte *)0x0)) ||
             ((pbVar13 < pbVar22 + (ulong)(pbVar13[-1] == 0xd) + 1 &&
              (((pbVar22 = pbVar13, pbVar17 <= pbVar13 || (*pbVar13 == 10)) ||
               (pbVar13 = (byte *)memchr(pbVar13,10,(long)pbVar17 - (long)pbVar13),
               pbVar13 == (byte *)0x0)))))) goto LAB_001600df;
          lVar15 = strtol((char *)pbVar22,(char **)0x0,0x10);
          lVar18 = -lVar15;
          phVar21 = args->parser;
          (phVar21->state).content_length = lVar18;
          pbVar13 = pbVar13 + 1;
          if (lVar15 == 0) goto LAB_0015ffe0;
        }
        pbVar22 = pbVar13 + -lVar18;
        if (pbVar17 < pbVar13 + -lVar18) {
          pbVar22 = pbVar17;
        }
        sVar12 = (long)pbVar22 - (long)pbVar13;
        if (pbVar13 <= pbVar22 && sVar12 != 0) {
          sVar12 = (long)pbVar22 - (long)pbVar13;
          iVar8 = (*args->on_body_chunk)(phVar21,(char *)pbVar13,sVar12);
          if (iVar8 != 0) goto LAB_001600fd;
          phVar21 = args->parser;
          lVar18 = (phVar21->state).content_length;
        }
        psVar2 = &(phVar21->state).read;
        *psVar2 = *psVar2 + sVar12;
        lVar18 = lVar18 + sVar12;
        (phVar21->state).content_length = lVar18;
        pbVar13 = pbVar22;
      } while( true );
    }
  }
  else {
    lVar15 = (phVar21->state).read;
    if (lVar15 < lVar18) {
      pbVar13 = (byte *)((long)args->buffer + args->length);
      if (pbVar22 + (lVar18 - lVar15) <= pbVar13) {
        pbVar13 = pbVar22 + (lVar18 - lVar15);
      }
      sVar12 = (long)pbVar13 - (long)pbVar22;
      if (pbVar22 <= pbVar13 && sVar12 != 0) {
        sVar12 = (long)pbVar13 - (long)pbVar22;
        iVar8 = (*args->on_body_chunk)(phVar21,(char *)pbVar22,sVar12);
        if (iVar8 != 0) goto LAB_001600fd;
        phVar21 = args->parser;
        lVar18 = (phVar21->state).content_length;
        lVar15 = (phVar21->state).read;
      }
      (phVar21->state).read = sVar12 + lVar15;
      pbVar22 = pbVar13;
      if ((long)(sVar12 + lVar15) < lVar18) goto LAB_001600df;
      bVar20 = (phVar21->state).reserved;
    }
  }
  (phVar21->state).reserved = bVar20 | 4;
  pbVar22 = pbVar13;
  goto LAB_001600df;
LAB_0015ffe0:
  (phVar21->state).content_length = (phVar21->state).read;
  pbVar22 = pbVar13;
  if ((pbVar13 < pbVar17) && (*pbVar13 != 10)) {
    pvVar10 = memchr(pbVar13,10,(long)pbVar17 - (long)pbVar13);
    pbVar22 = (byte *)((long)pvVar10 + 1);
    if (pvVar10 == (void *)0x0) {
      pbVar22 = pbVar17;
    }
  }
  bVar5 = (phVar21->state).reserved;
  bVar20 = bVar5 & 0xdd;
  bVar26 = (bVar5 & 0x20) == 0;
  bVar6 = bVar20;
  if (bVar26) {
    bVar6 = bVar5 | 4;
  }
  (phVar21->state).reserved = bVar6;
  if (bVar26) {
LAB_001600df:
    bVar20 = (phVar21->state).reserved;
    if ((bVar20 & 4) != 0) {
      (phVar21->state).next = pbVar22;
      iVar8 = (*(&args->on_request)[bVar20 >> 7])(phVar21);
      if (iVar8 != 0) {
LAB_001600fd:
        (*args->on_error)(args->parser);
        phVar21 = args->parser;
        (phVar21->state).content_length = 0;
        (phVar21->state).read = 0;
        (phVar21->state).next = (uint8_t *)0x0;
        (phVar21->state).reserved = '\0';
        *(undefined7 *)&(phVar21->state).field_0x19 = 0;
        return args->length;
      }
      phVar21 = args->parser;
      (phVar21->state).next = (uint8_t *)0x0;
      (phVar21->state).reserved = '\0';
      *(undefined7 *)&(phVar21->state).field_0x19 = 0;
      (phVar21->state).content_length = 0;
      (phVar21->state).read = 0;
    }
LAB_00160135:
    return (long)pbVar22 - (long)args->buffer;
  }
  goto LAB_0015f83c;
}

Assistant:

size_t http1_fio_parser_fn(struct http1_fio_parser_args_s *args) {
  assert(args->parser && args->buffer);
  args->parser->state.next = NULL;
  uint8_t *start = args->buffer;
  uint8_t *end = start;
  uint8_t *const stop = start + args->length;
  uint8_t eol_len = 0;
#define CONSUMED ((size_t)((uintptr_t)start - (uintptr_t)args->buffer))
// fprintf(stderr, "** resuming with at %p with %.*s...(%lu)\n", args->buffer,
// 4,
//         start, args->length);
re_eval:
  switch ((args->parser->state.reserved & 15)) {

  /* request / response line */
  case 0:
    /* clear out any leadinng white space */
    while ((start < stop) &&
           (*start == '\r' || *start == '\n' || *start == ' ' || *start == 0)) {
      ++start;
    }
    end = start;
    /* make sure the whole line is available*/
    if (!(eol_len = seek2eol(&end, stop)))
      return CONSUMED;

    if (start[0] == 'H' && start[1] == 'T' && start[2] == 'T' &&
        start[3] == 'P') {
      /* HTTP response */
      if (consume_response_line(args, start, end - eol_len + 1))
        goto error;
    } else if (tolower(start[0]) >= 'a' && tolower(start[0]) <= 'z') {
      /* HTTP request */
      if (consume_request_line(args, start, end - eol_len + 1))
        goto error;
    }
    end = start = end + 1;
    args->parser->state.reserved |= 1;

  /* fallthrough */
  /* headers */
  case 1:
    do {
      if (start >= stop)
        return CONSUMED; /* buffer ended on header line */
      if (*start == '\r' || *start == '\n') {
        goto finished_headers; /* empty line, end of headers */
      }
      if (!(eol_len = seek2eol(&end, stop)))
        return CONSUMED;
      if (consume_header(args, start, end - eol_len + 1))
        goto error;
      end = start = end + 1;
    } while ((args->parser->state.reserved & 2) == 0);
  finished_headers:
    ++start;
    if (*start == '\n')
      ++start;
    end = start;
    args->parser->state.reserved |= 2;
  /* fallthrough */
  /* request body */
  case 3: { /*  2 | 1 == 3 */
    int t3 = consume_body(args, &start);
    switch (t3) {
    case -1:
      goto error;
    case -2:
      goto re_eval;
    }
    break;
  }
  }
  /* are we done ? */
  if (args->parser->state.reserved & 4) {
    args->parser->state.next = start;
    if (((args->parser->state.reserved & 128) ? args->on_response
                                              : args->on_request)(args->parser))
      goto error;
    args->parser->state =
        (struct http1_parser_protected_read_only_state_s){0, 0, 0};
  }
  return CONSUMED;
error:
  args->on_error(args->parser);
  args->parser->state =
      (struct http1_parser_protected_read_only_state_s){0, 0, 0};
  return args->length;
}